

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFloat_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,float val)

{
  undefined1 local_48 [8];
  StringBaseTextGenerator generator;
  float val_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._12_4_ = val;
  anon_unknown_14::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  FastFieldValuePrinter::PrintFloat
            (&this->delegate_,(float)generator.output_.field_2._12_4_,(BaseTextGenerator *)local_48)
  ;
  protobuf::(anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_48);
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFloat(float val) const {
  FORWARD_IMPL(PrintFloat, val);
}